

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benckmark.cpp
# Opt level: O1

int Option::process_parameters(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  
  do {
    while (iVar1 = getopt(argc,argv,"h:p:t:c:aw:d:"), 0x6f < iVar1) {
      if (iVar1 == 0x70) {
        iVar1 = atoi(_optarg);
        gOption.server_port_ = (uint16_t)iVar1;
      }
      else if (iVar1 == 0x74) {
        iVar1 = atoi(_optarg);
        gOption.thread_num_ = (size_t)iVar1;
      }
      else {
        if (iVar1 != 0x77) goto switchD_00104487_caseD_62;
        uVar2 = atoi(_optarg);
        gOption.connect_timeout_ms_ = (size_t)uVar2;
      }
    }
    switch(iVar1) {
    case 0x61:
      gOption.is_keep_alive_ = true;
      break;
    case 99:
      uVar2 = atoi(_optarg);
      gOption.concurrent_num_ = (size_t)(uVar2 & 0xffff);
      break;
    case 100:
      gOption.duration_ = atoi(_optarg);
      break;
    case 0x68:
      gOption.server_ip_ = _optarg;
      break;
    default:
      if (iVar1 == -1) {
        return 0;
      }
    case 0x62:
    case 0x65:
    case 0x66:
    case 0x67:
switchD_00104487_caseD_62:
      printDefautOption();
      return 0;
    }
  } while( true );
}

Assistant:

int Option::process_parameters(int argc, char** argv)
{
    int c;
    while ((c = getopt(argc, argv, "h:p:t:c:aw:d:")) != -1) {
        switch (c) {
        case 'a':gOption.is_keep_alive_ = true;
            break;
        case 'h':gOption.server_ip_ = optarg;
            break;
        case 't':gOption.thread_num_ = (size_t) atoi(optarg);
            break;
        case 'p':gOption.server_port_ = (uint16_t) atoi(optarg);
            break;
        case 'c':gOption.concurrent_num_ = (uint16_t) atoi(optarg);
            break;
        case 'd':gOption.duration_ = (uint32_t) atoi(optarg);
            break;
        case 'w':gOption.connect_timeout_ms_ = (uint32_t) atoi(optarg);
            break;
        default:Option::printDefautOption();
            return 0;
        }
    }

    return 0;
}